

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O2

void __thiscall wasm::ABI::wasm2js::ensureHelpers(wasm2js *this,Module *wasm,IString specific)

{
  size_t sVar1;
  char *pcVar2;
  initializer_list<wasm::Type> types;
  Name name;
  initializer_list<wasm::Type> types_00;
  Name name_00;
  Name name_01;
  initializer_list<wasm::Type> types_01;
  Name name_02;
  Name name_03;
  initializer_list<wasm::Type> types_02;
  Name name_04;
  initializer_list<wasm::Type> types_03;
  Name name_05;
  initializer_list<wasm::Type> types_04;
  Name name_06;
  initializer_list<wasm::Type> types_05;
  Name name_07;
  initializer_list<wasm::Type> types_06;
  Name name_08;
  initializer_list<wasm::Type> types_07;
  Name name_09;
  initializer_list<wasm::Type> types_08;
  Name name_10;
  Name name_11;
  Name name_12;
  Module *local_e0;
  IString specific_local;
  Module *wasm_local;
  Type local_c0;
  Type local_b8;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Type local_88;
  Type local_80;
  Type local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_40 [8];
  anon_class_16_2_b3eb4c27 ensureImport;
  
  pcVar2 = DAT_00e64600;
  sVar1 = SCRATCH_LOAD_I32;
  specific_local.str._M_len = specific.str._M_len;
  ensureImport.wasm = &local_e0;
  local_40 = (undefined1  [8])&specific_local.str._M_str;
  local_78.id = 2;
  types._M_len = 1;
  types._M_array = &local_78;
  local_e0 = wasm;
  specific_local.str._M_str = (char *)this;
  wasm::Type::Type((Type *)&wasm_local,types);
  name.super_IString.str._M_str = pcVar2;
  name.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name,(Type)wasm_local,(Type)0x2);
  pcVar2 = DAT_00e64610;
  sVar1 = SCRATCH_STORE_I32;
  local_78.id = 2;
  uStack_70 = 2;
  types_00._M_len = 2;
  types_00._M_array = &local_78;
  wasm::Type::Type(&local_c0,types_00);
  name_00.super_IString.str._M_str = pcVar2;
  name_00.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_00,local_c0,(Type)0x0);
  name_01.super_IString.str._M_str = DAT_00e64620;
  name_01.super_IString.str._M_len = SCRATCH_LOAD_F32;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_01,(Type)0x0,(Type)0x4);
  pcVar2 = DAT_00e64630;
  sVar1 = SCRATCH_STORE_F32;
  local_78.id = 4;
  types_01._M_len = 1;
  types_01._M_array = &local_78;
  wasm::Type::Type(&local_b8,types_01);
  name_02.super_IString.str._M_str = pcVar2;
  name_02.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_02,local_b8,(Type)0x0);
  name_03.super_IString.str._M_str = DAT_00e64640;
  name_03.super_IString.str._M_len = SCRATCH_LOAD_F64;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_03,(Type)0x0,(Type)0x5);
  pcVar2 = DAT_00e64650;
  sVar1 = SCRATCH_STORE_F64;
  local_78.id = 5;
  types_02._M_len = 1;
  types_02._M_array = &local_78;
  wasm::Type::Type(&local_b0,types_02);
  name_04.super_IString.str._M_str = pcVar2;
  name_04.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_04,local_b0,(Type)0x0);
  pcVar2 = DAT_00e64660;
  sVar1 = MEMORY_INIT;
  local_68 = 2;
  uStack_60 = 2;
  local_78.id = 2;
  uStack_70 = 2;
  types_03._M_len = 4;
  types_03._M_array = &local_78;
  wasm::Type::Type(&local_a8,types_03);
  name_05.super_IString.str._M_str = pcVar2;
  name_05.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_05,local_a8,(Type)0x0);
  pcVar2 = DAT_00e64670;
  sVar1 = MEMORY_FILL;
  local_78.id = 2;
  uStack_70 = 2;
  local_68 = 2;
  types_04._M_len = 3;
  types_04._M_array = &local_78;
  wasm::Type::Type(&local_a0,types_04);
  name_06.super_IString.str._M_str = pcVar2;
  name_06.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_06,local_a0,(Type)0x0);
  pcVar2 = DAT_00e64680;
  sVar1 = MEMORY_COPY;
  local_78.id = 2;
  uStack_70 = 2;
  local_68 = 2;
  types_05._M_len = 3;
  types_05._M_array = &local_78;
  wasm::Type::Type(&local_98,types_05);
  name_07.super_IString.str._M_str = pcVar2;
  name_07.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_07,local_98,(Type)0x0);
  pcVar2 = DAT_00e64690;
  sVar1 = DATA_DROP;
  local_78.id = 2;
  types_06._M_len = 1;
  types_06._M_array = &local_78;
  wasm::Type::Type(&local_90,types_06);
  name_08.super_IString.str._M_str = pcVar2;
  name_08.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_08,local_90,(Type)0x0);
  pcVar2 = DAT_00e646a0;
  sVar1 = ATOMIC_WAIT_I32;
  local_68 = 2;
  uStack_60 = 2;
  local_78.id = 2;
  uStack_70 = 2;
  local_58 = 2;
  types_07._M_len = 5;
  types_07._M_array = &local_78;
  wasm::Type::Type(&local_88,types_07);
  name_09.super_IString.str._M_str = pcVar2;
  name_09.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_09,local_88,(Type)0x2);
  pcVar2 = DAT_00e646b0;
  sVar1 = ATOMIC_RMW_I64;
  local_58 = 2;
  uStack_50 = 2;
  local_68 = 2;
  uStack_60 = 2;
  local_78.id = 2;
  uStack_70 = 2;
  types_08._M_len = 6;
  types_08._M_array = &local_78;
  wasm::Type::Type(&local_80,types_08);
  name_10.super_IString.str._M_str = pcVar2;
  name_10.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_10,local_80,(Type)0x2);
  name_11.super_IString.str._M_str = DAT_00e646c0;
  name_11.super_IString.str._M_len = GET_STASHED_BITS;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_11,(Type)0x0,(Type)0x2);
  name_12.super_IString.str._M_str = DAT_00e646d0;
  name_12.super_IString.str._M_len = TRAP;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_12,(Type)0x0,(Type)0x0);
  return;
}

Assistant:

inline void ensureHelpers(Module* wasm, IString specific = IString()) {
  auto ensureImport = [&](Name name, Type params, Type results) {
    if (wasm->getFunctionOrNull(name)) {
      return;
    }
    if (specific.is() && name != specific) {
      return;
    }
    auto func = Builder::makeFunction(name, Signature(params, results), {});
    func->module = ENV;
    func->base = name;
    wasm->addFunction(std::move(func));
  };

  ensureImport(SCRATCH_LOAD_I32, {Type::i32}, Type::i32);
  ensureImport(SCRATCH_STORE_I32, {Type::i32, Type::i32}, Type::none);
  ensureImport(SCRATCH_LOAD_F32, {}, Type::f32);
  ensureImport(SCRATCH_STORE_F32, {Type::f32}, Type::none);
  ensureImport(SCRATCH_LOAD_F64, {}, Type::f64);
  ensureImport(SCRATCH_STORE_F64, {Type::f64}, Type::none);
  ensureImport(
    MEMORY_INIT, {Type::i32, Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(MEMORY_FILL, {Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(MEMORY_COPY, {Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(DATA_DROP, {Type::i32}, Type::none);
  ensureImport(ATOMIC_WAIT_I32,
               {Type::i32, Type::i32, Type::i32, Type::i32, Type::i32},
               Type::i32);
  ensureImport(
    ATOMIC_RMW_I64,
    {Type::i32, Type::i32, Type::i32, Type::i32, Type::i32, Type::i32},
    Type::i32);
  ensureImport(GET_STASHED_BITS, {}, Type::i32);
  ensureImport(TRAP, {}, Type::none);
}